

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

Result * CoreML::Model::validateGeneric(Result *__return_storage_ptr__,Model *model)

{
  bool bVar1;
  int32 iVar2;
  ostream *poVar3;
  ModelDescription *interface;
  Result local_2b0;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  string err;
  undefined1 local_220 [8];
  Result r;
  stringstream local_1d8 [8];
  stringstream msg;
  ostream local_1c8 [399];
  allocator local_39;
  string local_38;
  Model *local_18;
  Model *model_local;
  
  local_18 = model;
  model_local = (Model *)__return_storage_ptr__;
  iVar2 = Specification::Model::specificationversion(model);
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"Model specification version field missing or corrupt.",&local_39
              );
    Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    return __return_storage_ptr__;
  }
  iVar2 = Specification::Model::specificationversion(local_18);
  if (5 < iVar2) {
    std::__cxx11::stringstream::stringstream(local_1d8);
    poVar3 = std::operator<<(local_1c8,"The .mlmodel supplied is of version ");
    iVar2 = Specification::Model::specificationversion(local_18);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,
                             ", intended for a newer version of Xcode. This version of Xcode supports model version "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,5);
    std::operator<<(poVar3," or earlier.");
    std::__cxx11::stringstream::str();
    Result::Result(__return_storage_ptr__,UNSUPPORTED_COMPATIBILITY_VERSION,
                   (string *)((long)&r.m_message.field_2 + 8));
    std::__cxx11::string::~string((string *)(r.m_message.field_2._M_local_buf + 8));
    std::__cxx11::stringstream::~stringstream(local_1d8);
    return __return_storage_ptr__;
  }
  interface = Specification::Model::description(local_18);
  iVar2 = Specification::Model::specificationversion(local_18);
  validateModelDescription((Result *)local_220,interface,iVar2);
  bVar1 = Result::good((Result *)local_220);
  if (bVar1) {
    bVar1 = Specification::Model::isupdatable(local_18);
    if (bVar1) {
      iVar2 = Specification::Model::specificationversion(local_18);
      if (iVar2 < 4) {
        std::__cxx11::to_string(&local_288,4);
        std::operator+(&local_268,"Model specification version for an updatable model must be \'",
                       &local_288);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248,&local_268,"\' or above.");
        std::__cxx11::string::~string((string *)&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,(string *)local_248);
        err.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_248);
        goto LAB_0097b792;
      }
      validateCanModelBeUpdatable(&local_2b0,local_18);
      Result::operator=((Result *)local_220,&local_2b0);
      Result::~Result(&local_2b0);
    }
    bVar1 = Result::good((Result *)local_220);
    if (bVar1) {
      validateOptional(__return_storage_ptr__,local_18);
      err.field_2._12_4_ = 1;
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_220);
      err.field_2._12_4_ = 1;
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_220);
    err.field_2._12_4_ = 1;
  }
LAB_0097b792:
  Result::~Result((Result *)local_220);
  return __return_storage_ptr__;
}

Assistant:

Result Model::validateGeneric(const Specification::Model& model) {
        // make sure compat version fields are filled in
        if (model.specificationversion() == 0) {
            return Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                          "Model specification version field missing or corrupt.");
        }

        // check public compatibility version
        // note: this one should always be backward compatible, so use > here
        if (model.specificationversion() > MLMODEL_SPECIFICATION_VERSION) {
            std::stringstream msg;
            msg << "The .mlmodel supplied is of version "
                << model.specificationversion()
                << ", intended for a newer version of Xcode. This version of Xcode supports model version "
                << MLMODEL_SPECIFICATION_VERSION
                << " or earlier.";
            return Result(ResultType::UNSUPPORTED_COMPATIBILITY_VERSION,
                          msg.str());
        }

        // validate model interface
        Result r = validateModelDescription(model.description(), model.specificationversion());
        if (!r.good()) {
            return r;
        }
        
        if (model.isupdatable()){
            if (model.specificationversion() < MLMODEL_SPECIFICATION_VERSION_IOS13) {
                std::string err = "Model specification version for an updatable model must be '" + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS13) + "' or above.";
                return Result(ResultType::INVALID_COMPATIBILITY_VERSION, err);
            }
            r = validateCanModelBeUpdatable(model);
        }
        if (!r.good()) {
            return r;
        }

        return validateOptional(model);
    }